

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O1

void ncnn::conv3x3s1_winograd23_transform_kernel_int8_sse
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  undefined2 uVar1;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  int iVar7;
  undefined8 *puVar8;
  long lVar9;
  undefined8 *puVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  short tmp [4] [3];
  undefined2 auStack_4c [2];
  undefined1 local_48 [16];
  undefined8 local_38;
  
  Mat::create(kernel_tm,0x10,inch,outch,2,(Allocator *)0x0);
  auVar5 = _DAT_0031fa10;
  if (0 < outch) {
    pvVar3 = kernel->data;
    iVar2 = kernel_tm->w;
    uVar6 = 0;
    auVar12._8_8_ = 0x100010002;
    auVar12._0_8_ = 0x100010002;
    auVar13._8_8_ = 0xffff00010000;
    auVar13._0_8_ = 0xffff00010000;
    auVar14._8_8_ = 0x2000100010000;
    auVar14._0_8_ = 0x2000100010000;
    do {
      if (0 < inch) {
        iVar7 = inch * 9 * (int)uVar6;
        sVar4 = kernel_tm->elemsize;
        puVar8 = (undefined8 *)(kernel_tm->cstep * sVar4 * uVar6 + (long)kernel_tm->data);
        uVar11 = 0;
        do {
          lVar9 = uVar11 * 9;
          auVar15._0_2_ = (short)*(char *)((long)pvVar3 + lVar9 + iVar7);
          auVar15._2_2_ = auVar15._0_2_;
          auVar15._4_2_ = auVar15._0_2_;
          auVar15._6_2_ = auVar15._0_2_;
          auVar15._8_2_ = auVar15._0_2_;
          auVar15._10_2_ = auVar15._0_2_;
          auVar15._12_2_ = auVar15._0_2_;
          auVar15._14_2_ = auVar15._0_2_;
          auVar17._0_2_ = (short)*(char *)((long)pvVar3 + lVar9 + (long)iVar7 + 1);
          auVar17._2_2_ = auVar17._0_2_;
          auVar17._4_2_ = auVar17._0_2_;
          auVar17._6_2_ = auVar17._0_2_;
          auVar17._8_2_ = auVar17._0_2_;
          auVar17._10_2_ = auVar17._0_2_;
          auVar17._12_2_ = auVar17._0_2_;
          auVar17._14_2_ = auVar17._0_2_;
          auVar21._0_2_ = (short)*(char *)((long)pvVar3 + lVar9 + (long)iVar7 + 2);
          auVar21._2_2_ = auVar21._0_2_;
          auVar21._4_2_ = auVar21._0_2_;
          auVar21._6_2_ = auVar21._0_2_;
          auVar21._8_2_ = auVar21._0_2_;
          auVar21._10_2_ = auVar21._0_2_;
          auVar21._12_2_ = auVar21._0_2_;
          auVar21._14_2_ = auVar21._0_2_;
          auVar22._0_2_ = (short)*(char *)((long)pvVar3 + lVar9 + (long)iVar7 + 3);
          auVar22._2_2_ = auVar22._0_2_;
          auVar22._4_2_ = auVar22._0_2_;
          auVar22._6_2_ = auVar22._0_2_;
          auVar22._8_2_ = auVar22._0_2_;
          auVar22._10_2_ = auVar22._0_2_;
          auVar22._12_2_ = auVar22._0_2_;
          auVar22._14_2_ = auVar22._0_2_;
          auVar23._0_2_ = (short)*(char *)((long)pvVar3 + lVar9 + (long)iVar7 + 4);
          auVar23._2_2_ = auVar23._0_2_;
          auVar23._4_2_ = auVar23._0_2_;
          auVar23._6_2_ = auVar23._0_2_;
          auVar23._8_2_ = auVar23._0_2_;
          auVar23._10_2_ = auVar23._0_2_;
          auVar23._12_2_ = auVar23._0_2_;
          auVar23._14_2_ = auVar23._0_2_;
          auVar24._0_2_ = (short)*(char *)((long)pvVar3 + lVar9 + (long)iVar7 + 5);
          auVar24._2_2_ = auVar24._0_2_;
          auVar24._4_2_ = auVar24._0_2_;
          auVar24._6_2_ = auVar24._0_2_;
          auVar24._8_2_ = auVar24._0_2_;
          auVar24._10_2_ = auVar24._0_2_;
          auVar24._12_2_ = auVar24._0_2_;
          auVar24._14_2_ = auVar24._0_2_;
          auVar25._0_2_ = (short)*(char *)((long)pvVar3 + lVar9 + (long)iVar7 + 6);
          auVar25._2_2_ = auVar25._0_2_;
          auVar25._4_2_ = auVar25._0_2_;
          auVar25._6_2_ = auVar25._0_2_;
          auVar25._8_2_ = auVar25._0_2_;
          auVar25._10_2_ = auVar25._0_2_;
          auVar25._12_2_ = auVar25._0_2_;
          auVar25._14_2_ = auVar25._0_2_;
          auVar26._0_2_ = (short)*(char *)((long)pvVar3 + lVar9 + (long)iVar7 + 7);
          auVar26._2_2_ = auVar26._0_2_;
          auVar26._4_2_ = auVar26._0_2_;
          auVar26._6_2_ = auVar26._0_2_;
          auVar26._8_2_ = auVar26._0_2_;
          auVar26._10_2_ = auVar26._0_2_;
          auVar26._12_2_ = auVar26._0_2_;
          auVar26._14_2_ = auVar26._0_2_;
          auVar27._0_2_ = (short)*(char *)((long)pvVar3 + lVar9 + (long)iVar7 + 8);
          auVar27._2_2_ = auVar27._0_2_;
          auVar27._4_2_ = auVar27._0_2_;
          auVar27._6_2_ = auVar27._0_2_;
          auVar27._8_2_ = auVar27._0_2_;
          auVar27._10_2_ = auVar27._0_2_;
          auVar27._12_2_ = auVar27._0_2_;
          auVar27._14_2_ = auVar27._0_2_;
          auVar15 = vpmullw_avx(auVar15,auVar12);
          auVar17 = vpmullw_avx(auVar17,auVar13);
          auVar15 = vpaddw_avx(auVar17,auVar15);
          auVar17 = vpmullw_avx(auVar21,auVar14);
          auVar15 = vpaddw_avx(auVar17,auVar15);
          auVar17 = vpmullw_avx(auVar22,auVar12);
          auVar21 = vpmullw_avx(auVar23,auVar13);
          auVar17 = vpaddw_avx(auVar21,auVar17);
          auVar21 = vpmullw_avx(auVar24,auVar14);
          auVar17 = vpaddw_avx(auVar17,auVar21);
          auVar18 = vpunpcklqdq_avx(auVar15,auVar17);
          auVar15 = vpmullw_avx(auVar25,auVar12);
          auVar17 = vpmullw_avx(auVar26,auVar13);
          auVar15 = vpaddw_avx(auVar17,auVar15);
          auVar17 = vpmullw_avx(auVar27,auVar14);
          auVar15 = vpaddw_avx(auVar15,auVar17);
          auVar17 = vpshufd_avx(auVar18,0xe7);
          auVar21 = vpshuflw_avx(auVar17,0xdc);
          auVar17 = vpshufd_avx(auVar15,0x55);
          auVar17 = vpblendw_avx(auVar21,auVar17,9);
          auVar21 = vpshufb_avx(auVar18,auVar5);
          auVar18._0_4_ = auVar15._0_4_;
          auVar18._4_4_ = auVar18._0_4_;
          auVar18._8_4_ = auVar18._0_4_;
          auVar18._12_4_ = auVar18._0_4_;
          local_48 = vpblendw_avx(auVar21,auVar18,0x24);
          local_38 = auVar17._0_8_;
          lVar9 = 4;
          puVar10 = puVar8;
          do {
            uVar1 = *(undefined2 *)((long)auStack_4c + lVar9);
            auVar16._2_2_ = uVar1;
            auVar16._0_2_ = uVar1;
            auVar16._4_2_ = uVar1;
            auVar16._6_2_ = uVar1;
            auVar16._8_2_ = uVar1;
            auVar16._10_2_ = uVar1;
            auVar16._12_2_ = uVar1;
            auVar16._14_2_ = uVar1;
            auVar15 = vpmullw_avx(auVar16,ZEXT816(0x100010002));
            uVar1 = *(undefined2 *)((long)auStack_4c + lVar9 + 2);
            auVar19._2_2_ = uVar1;
            auVar19._0_2_ = uVar1;
            auVar19._4_2_ = uVar1;
            auVar19._6_2_ = uVar1;
            auVar19._8_2_ = uVar1;
            auVar19._10_2_ = uVar1;
            auVar19._12_2_ = uVar1;
            auVar19._14_2_ = uVar1;
            auVar17 = vpmullw_avx(auVar19,ZEXT816(0xffff00010000));
            auVar15 = vpaddw_avx(auVar17,auVar15);
            uVar1 = *(undefined2 *)(local_48 + lVar9);
            auVar20._2_2_ = uVar1;
            auVar20._0_2_ = uVar1;
            auVar20._4_2_ = uVar1;
            auVar20._6_2_ = uVar1;
            auVar20._8_2_ = uVar1;
            auVar20._10_2_ = uVar1;
            auVar20._12_2_ = uVar1;
            auVar20._14_2_ = uVar1;
            auVar17 = vpmullw_avx(auVar20,ZEXT816(0x2000100010000));
            auVar15 = vpaddw_avx(auVar17,auVar15);
            *puVar10 = auVar15._0_8_;
            puVar10 = puVar10 + 1;
            lVar9 = lVar9 + 6;
          } while (lVar9 != 0x1c);
          uVar11 = uVar11 + 1;
          puVar8 = (undefined8 *)((long)puVar8 + sVar4 * (long)iVar2);
        } while (uVar11 != (uint)inch);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)outch);
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel_int8_sse(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    kernel_tm.create(4 * 4, inch, outch, (size_t)2u);

    // G
    const short ktm[4][3] = {
        {2, 0, 0},
        {1, 1, 1},
        {1, -1, 1},
        {0, 0, 2}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const signed char* kernel0 = (const signed char*)kernel + p * inch * 9 + q * 9;
            short* kernel_tm0 = kernel_tm.channel(p).row<short>(q);

            // transform kernel
            const signed char* k0 = kernel0;
            const signed char* k1 = kernel0 + 3;
            const signed char* k2 = kernel0 + 6;

            // h
            short tmp[4][3];
            for (int i = 0; i < 4; i++)
            {
                tmp[i][0] = (short)k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = (short)k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = (short)k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 4; j++)
            {
                short* tmpp = &tmp[j][0];

                for (int i = 0; i < 4; i++)
                {
                    kernel_tm0[j * 4 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }
}